

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ActivationParametricSoftplus::CopyFrom
          (ActivationParametricSoftplus *this,ActivationParametricSoftplus *from)

{
  ActivationParametricSoftplus *from_local;
  ActivationParametricSoftplus *this_local;
  
  if (from != this) {
    Clear(this);
    MergeFrom(this,from);
  }
  return;
}

Assistant:

void ActivationParametricSoftplus::CopyFrom(const ActivationParametricSoftplus& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.ActivationParametricSoftplus)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}